

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::NetAliasSyntax::NetAliasSyntax
          (NetAliasSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *nets,Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ExpressionSyntax *pEVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  size_t index;
  
  uVar6 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = NetAlias;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  SVar3 = (nets->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(nets->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.parent =
       (nets->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->nets).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->nets).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->nets).super_SyntaxListBase.childCount = (nets->super_SyntaxListBase).childCount;
  (this->nets).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed090;
  sVar1 = (nets->elements).size_;
  (this->nets).elements.data_ = (nets->elements).data_;
  (this->nets).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->nets).elements.size_ + 1;
  if (1 < uVar8) {
    index = 0;
    do {
      pEVar5 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[](&this->nets,index);
      (pEVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  return;
}

Assistant:

NetAliasSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<ExpressionSyntax>& nets, Token semi) :
        MemberSyntax(SyntaxKind::NetAlias, attributes), keyword(keyword), nets(nets), semi(semi) {
        this->nets.parent = this;
        for (auto child : this->nets)
            child->parent = this;
    }